

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ScriptFunction.cpp
# Opt level: O1

void __thiscall
Js::WasmScriptFunction::WasmScriptFunction
          (WasmScriptFunction *this,FunctionProxy *proxy,ScriptFunctionType *deferredPrototypeType)

{
  code *pcVar1;
  bool bVar2;
  undefined4 *puVar3;
  
  ScriptFunction::ScriptFunction((ScriptFunction *)this,proxy,deferredPrototypeType);
  (this->super_AsmJsScriptFunction).m_moduleEnvironment.ptr = (WriteBarrierPtr<void> *)0x0;
  (this->m_signature).ptr = (WasmSignature *)0x0;
  (this->super_AsmJsScriptFunction).super_ScriptFunction.super_ScriptFunctionBase.
  super_JavascriptFunction.super_DynamicObject.super_RecyclableObject.super_FinalizableObject =
       (FinalizableObject)&PTR_Finalize_014d25e0;
  if ((((proxy->functionInfo).ptr)->attributes & ComputedName) != None) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar3 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/ScriptFunction.cpp"
                                ,0x26a,"(!proxy->GetFunctionInfo()->HasComputedName())",
                                "!proxy->GetFunctionInfo()->HasComputedName()");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    *puVar3 = 0;
  }
  return;
}

Assistant:

WasmScriptFunction::WasmScriptFunction(FunctionProxy * proxy, ScriptFunctionType* deferredPrototypeType) :
        AsmJsScriptFunction(proxy, deferredPrototypeType), m_signature(nullptr)
    {
        Assert(!proxy->GetFunctionInfo()->HasComputedName());
    }